

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Pooling3DLayerParams::MergeFrom
          (Pooling3DLayerParams *this,Pooling3DLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x82e2);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->type_ != 0) {
    this->type_ = from->type_;
  }
  if (from->kerneldepth_ != 0) {
    this->kerneldepth_ = from->kerneldepth_;
  }
  if (from->kernelheight_ != 0) {
    this->kernelheight_ = from->kernelheight_;
  }
  if (from->kernelwidth_ != 0) {
    this->kernelwidth_ = from->kernelwidth_;
  }
  if (from->stridedepth_ != 0) {
    this->stridedepth_ = from->stridedepth_;
  }
  if (from->strideheight_ != 0) {
    this->strideheight_ = from->strideheight_;
  }
  if (from->stridewidth_ != 0) {
    this->stridewidth_ = from->stridewidth_;
  }
  if (from->custompaddingfront_ != 0) {
    this->custompaddingfront_ = from->custompaddingfront_;
  }
  if (from->custompaddingback_ != 0) {
    this->custompaddingback_ = from->custompaddingback_;
  }
  if (from->custompaddingtop_ != 0) {
    this->custompaddingtop_ = from->custompaddingtop_;
  }
  if (from->custompaddingbottom_ != 0) {
    this->custompaddingbottom_ = from->custompaddingbottom_;
  }
  if (from->custompaddingleft_ != 0) {
    this->custompaddingleft_ = from->custompaddingleft_;
  }
  if (from->custompaddingright_ != 0) {
    this->custompaddingright_ = from->custompaddingright_;
  }
  if (from->countexcludepadding_ == true) {
    this->countexcludepadding_ = true;
  }
  if (from->paddingtype_ != 0) {
    this->paddingtype_ = from->paddingtype_;
  }
  return;
}

Assistant:

void Pooling3DLayerParams::MergeFrom(const Pooling3DLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Pooling3DLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.type() != 0) {
    set_type(from.type());
  }
  if (from.kerneldepth() != 0) {
    set_kerneldepth(from.kerneldepth());
  }
  if (from.kernelheight() != 0) {
    set_kernelheight(from.kernelheight());
  }
  if (from.kernelwidth() != 0) {
    set_kernelwidth(from.kernelwidth());
  }
  if (from.stridedepth() != 0) {
    set_stridedepth(from.stridedepth());
  }
  if (from.strideheight() != 0) {
    set_strideheight(from.strideheight());
  }
  if (from.stridewidth() != 0) {
    set_stridewidth(from.stridewidth());
  }
  if (from.custompaddingfront() != 0) {
    set_custompaddingfront(from.custompaddingfront());
  }
  if (from.custompaddingback() != 0) {
    set_custompaddingback(from.custompaddingback());
  }
  if (from.custompaddingtop() != 0) {
    set_custompaddingtop(from.custompaddingtop());
  }
  if (from.custompaddingbottom() != 0) {
    set_custompaddingbottom(from.custompaddingbottom());
  }
  if (from.custompaddingleft() != 0) {
    set_custompaddingleft(from.custompaddingleft());
  }
  if (from.custompaddingright() != 0) {
    set_custompaddingright(from.custompaddingright());
  }
  if (from.countexcludepadding() != 0) {
    set_countexcludepadding(from.countexcludepadding());
  }
  if (from.paddingtype() != 0) {
    set_paddingtype(from.paddingtype());
  }
}